

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

void cs::prepend_import_path(string *script,process_context *context)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  string *in_RSI;
  ulong in_RDI;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  any *in_stack_fffffffffffffea8;
  any *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128 [20];
  int in_stack_fffffffffffffeec;
  string local_108 [32];
  any local_e8 [4];
  string local_c8 [32];
  string local_a8 [48];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  process_context *in_stack_ffffffffffffffe8;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = cs_impl::file_system::is_absolute_path((string *)in_stack_fffffffffffffea0);
    if (bVar1) {
      lVar3 = std::__cxx11::string::find_last_of((char)in_RDI,0x2f);
      if (lVar3 == 0) {
        __lhs = local_e8;
        std::__cxx11::to_string(in_stack_fffffffffffffeec);
        std::operator+(__lhs,(char)((ulong)in_stack_fffffffffffffea0 >> 0x38));
        std::operator+(__lhs,in_stack_fffffffffffffea0);
        std::__cxx11::string::operator=((string *)(in_RSI + 0xb),local_a8);
        std::__cxx11::string::~string(local_a8);
        std::__cxx11::string::~string(local_c8);
        std::__cxx11::string::~string((string *)local_e8);
      }
      else {
        std::__cxx11::string::substr((ulong)local_78,in_RDI);
        std::operator+(in_stack_fffffffffffffea8,(char)((ulong)in_stack_fffffffffffffea0 >> 0x38));
        std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
        std::__cxx11::string::operator=((string *)(in_RSI + 0xb),local_38);
        std::__cxx11::string::~string(local_38);
        std::__cxx11::string::~string(local_58);
        std::__cxx11::string::~string(local_78);
      }
    }
    else {
      __rhs = &local_148;
      cs_impl::file_system::get_current_dir_abi_cxx11_();
      std::operator+(in_stack_fffffffffffffea8,(char)((ulong)__rhs >> 0x38));
      std::operator+(in_stack_fffffffffffffea8,__rhs);
      prepend_import_path(in_RSI,in_stack_ffffffffffffffe8);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string((string *)&local_148);
    }
  }
  return;
}

Assistant:

void prepend_import_path(const std::string &script, cs::process_context *context)
	{
		if (script.empty()) {
			return;
		}

		if (cs_impl::file_system::is_absolute_path(script)) {
			// If it's absolute path
			auto pos = script.find_last_of(cs::path_separator);

			// in case of: /main.csc
			if (pos > 0) {
				context->import_path = script.substr(0, pos)
				                       + cs::path_delimiter + context->import_path;
			}
			else {
				context->import_path = std::to_string(cs::path_separator)
				                       + cs::path_delimiter + context->import_path;
			}

		}
		else {
			// If it's relative path
			prepend_import_path(cs_impl::file_system::get_current_dir()
			                    + cs::path_separator
			                    + script, context);
		}
	}